

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O2

void __thiscall
S2Builder::EdgeChainSimplifier::SimplifyChain(EdgeChainSimplifier *this,VertexId v0,VertexId v1)

{
  vector<int,_std::allocator<int>_> *this_00;
  VertexId *pVVar1;
  pointer piVar2;
  int v0_00;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  reference rVar6;
  VertexId local_90;
  int local_8c;
  S2PolylineSimplifier local_88;
  
  this_00 = &this->tmp_vertices_;
  local_88.y_dir_.c_[0] = 0.0;
  local_88.y_dir_.c_[1] = 0.0;
  local_88.x_dir_.c_[1] = 0.0;
  local_88.x_dir_.c_[2] = 0.0;
  local_88.src_.c_[2] = 0.0;
  local_88.x_dir_.c_[0] = 0.0;
  local_88.y_dir_.c_[2] = 0.0;
  local_88.src_.c_[0] = 0.0;
  local_88.src_.c_[1] = 0.0;
  local_88.window_.bounds_.c_[0] = 3.141592653589793;
  local_88.window_.bounds_.c_[1] = -3.141592653589793;
  local_90 = v1;
  local_8c = v0;
  do {
    S2PolylineSimplifier::Init
              (&local_88,
               (this->g_->vertices_->
               super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>)._M_impl.
               super__Vector_impl_data._M_start + local_8c);
    AvoidSites(this,local_8c,local_8c,local_90,&local_88);
    std::vector<int,_std::allocator<int>_>::push_back(this_00,&local_8c);
    do {
      std::vector<int,_std::allocator<int>_>::push_back(this_00,&local_90);
      rVar6 = std::vector<bool,_std::allocator<bool>_>::operator[]
                        (&this->is_interior_,(long)local_90);
      v0_00 = local_8c;
      bVar4 = (*rVar6._M_p & rVar6._M_mask) == 0;
      bVar5 = local_90 == v0;
      if (bVar5 || bVar4) break;
      local_8c = local_90;
      local_90 = FollowChain(this,v0_00,local_90);
      bVar3 = TargetInputVertices(this,local_8c,&local_88);
      if (!bVar3) break;
      bVar3 = AvoidSites(this,*(this->tmp_vertices_).super__Vector_base<int,_std::allocator<int>_>.
                               _M_impl.super__Vector_impl_data._M_start,local_8c,local_90,&local_88)
      ;
      if (!bVar3) break;
      bVar3 = S2PolylineSimplifier::Extend
                        (&local_88,
                         (this->g_->vertices_->
                         super__Vector_base<Vector3<double>,_std::allocator<Vector3<double>_>_>).
                         _M_impl.super__Vector_impl_data._M_start + local_90);
    } while (bVar3);
    pVVar1 = (this->tmp_vertices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((long)(this->tmp_vertices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)pVVar1 == 8) {
      OutputAllEdges(this,*pVVar1,pVVar1[1]);
    }
    else {
      MergeChain(this,this_00);
    }
    piVar2 = (this->tmp_vertices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((this->tmp_vertices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish != piVar2) {
      (this->tmp_vertices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = piVar2;
    }
    if (bVar5 || bVar4) {
      return;
    }
  } while( true );
}

Assistant:

void S2Builder::EdgeChainSimplifier::SimplifyChain(VertexId v0, VertexId v1) {
  // Avoid allocating "chain" each time by reusing it.
  vector<VertexId>& chain = tmp_vertices_;
  S2PolylineSimplifier simplifier;
  VertexId vstart = v0;
  bool done = false;
  do {
    // Simplify a subchain of edges starting (v0, v1).
    simplifier.Init(g_.vertex(v0));
    AvoidSites(v0, v0, v1, &simplifier);
    chain.push_back(v0);
    do {
      chain.push_back(v1);
      done = !is_interior_[v1] || v1 == vstart;
      if (done) break;

      // Attempt to extend the chain to the next vertex.
      VertexId vprev = v0;
      v0 = v1;
      v1 = FollowChain(vprev, v0);
    } while (TargetInputVertices(v0, &simplifier) &&
             AvoidSites(chain[0], v0, v1, &simplifier) &&
             simplifier.Extend(g_.vertex(v1)));

    if (chain.size() == 2) {
      OutputAllEdges(chain[0], chain[1]);  // Could not simplify.
    } else {
      MergeChain(chain);
    }
    // Note that any degenerate edges that were not merged into a chain are
    // output by EdgeChainSimplifier::Run().
    chain.clear();
  } while (!done);
}